

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O0

void ma_bpf_uninit(ma_bpf *pBPF,ma_allocation_callbacks *pAllocationCallbacks)

{
  ma_bpf2 *in_RSI;
  long in_RDI;
  ma_uint32 ibpf2;
  undefined4 in_stack_ffffffffffffffe8;
  uint uVar1;
  
  if (in_RDI != 0) {
    for (uVar1 = 0; uVar1 < *(uint *)(in_RDI + 8); uVar1 = uVar1 + 1) {
      ma_bpf2_uninit(in_RSI,(ma_allocation_callbacks *)CONCAT44(uVar1,in_stack_ffffffffffffffe8));
    }
    if (*(int *)(in_RDI + 0x20) != 0) {
      ma_free(in_RSI,(ma_allocation_callbacks *)CONCAT44(uVar1,in_stack_ffffffffffffffe8));
    }
  }
  return;
}

Assistant:

MA_API void ma_bpf_uninit(ma_bpf* pBPF, const ma_allocation_callbacks* pAllocationCallbacks)
{
    ma_uint32 ibpf2;

    if (pBPF == NULL) {
        return;
    }

    for (ibpf2 = 0; ibpf2 < pBPF->bpf2Count; ibpf2 += 1) {
        ma_bpf2_uninit(&pBPF->pBPF2[ibpf2], pAllocationCallbacks);
    }

    if (pBPF->_ownsHeap) {
        ma_free(pBPF->_pHeap, pAllocationCallbacks);
    }
}